

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_buffer.cpp
# Opt level: O0

void testMapBuffer(void)

{
  void *pvVar1;
  GLvoid *ptr;
  GLuint buffers [2];
  
  if (GLAD_GL_VERSION_1_5 == 0) {
    fprintf(_stderr,"error: OpenGL version 1.5 not supported\n");
    exit(0x7d);
  }
  (*glad_glGenBuffers)(2,(GLuint *)&ptr);
  (*glad_glBindBuffer)(0x8892,(GLuint)ptr);
  (*glad_glBufferData)(0x8892,1000,(void *)0x0,0x88e4);
  pvVar1 = (*glad_glMapBuffer)(0x8892,0x88b9);
  memset(pvVar1,1,1000);
  (*glad_glUnmapBuffer)(0x8892);
  (*glad_glBindBuffer)(0x8892,ptr._4_4_);
  (*glad_glBufferData)(0x8892,2000,(void *)0x0,0x88e4);
  pvVar1 = (*glad_glMapBuffer)(0x8892,0x88b9);
  memset(pvVar1,2,2000);
  (*glad_glBindBuffer)(0x8892,(GLuint)ptr);
  pvVar1 = (*glad_glMapBuffer)(0x8892,0x88b9);
  memset(pvVar1,3,1000);
  (*glad_glBindBuffer)(0x8892,ptr._4_4_);
  (*glad_glUnmapBuffer)(0x8892);
  (*glad_glBindBuffer)(0x8892,(GLuint)ptr);
  (*glad_glUnmapBuffer)(0x8892);
  (*glad_glMapBuffer)(0x8892,35000);
  (*glad_glUnmapBuffer)(0x8892);
  (*glad_glDeleteBuffers)(2,(GLuint *)&ptr);
  return;
}

Assistant:

static void
testMapBuffer(void)
{
    GLuint buffers[2];
    GLvoid *ptr;

    if (!GLAD_GL_VERSION_1_5) {
        fprintf(stderr, "error: OpenGL version 1.5 not supported\n");
        exit(EXIT_SKIP);
    }

    glGenBuffers(2, buffers);

    glBindBuffer(target, buffers[0]);
    glBufferData(target, 1000, NULL, GL_STATIC_DRAW);

    ptr = glMapBuffer(target, GL_WRITE_ONLY);
    memset(ptr, 1, 1000);
    glUnmapBuffer(target);

    glBindBuffer(target, buffers[1]);
    glBufferData(target, 2000, NULL, GL_STATIC_DRAW);
    ptr = glMapBuffer(target, GL_WRITE_ONLY);
    memset(ptr, 2, 2000);

    glBindBuffer(target, buffers[0]);
    ptr = glMapBuffer(target, GL_WRITE_ONLY);
    memset(ptr, 3, 1000);

    glBindBuffer(target, buffers[1]);
    glUnmapBuffer(target);

    glBindBuffer(target, buffers[0]);
    glUnmapBuffer(target);

    glMapBuffer(target, GL_READ_ONLY);
    glUnmapBuffer(target);

    glDeleteBuffers(2, buffers);
}